

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

bool __thiscall duckdb::StandardColumnData::IsPersistent(StandardColumnData *this)

{
  bool bVar1;
  
  bVar1 = ColumnData::IsPersistent(&this->super_ColumnData);
  if (bVar1) {
    bVar1 = ColumnData::IsPersistent(&(this->validity).super_ColumnData);
    return bVar1;
  }
  return false;
}

Assistant:

bool StandardColumnData::IsPersistent() {
	return ColumnData::IsPersistent() && validity.IsPersistent();
}